

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

vm_obj_id_t CVmObjString::create(int in_root_set,wchar_t *str,size_t charlen)

{
  vm_obj_id_t obj_id;
  size_t sVar1;
  CVmObjString *this;
  long lVar2;
  size_t sVar3;
  char *p;
  
  if (charlen == 0) {
    sVar3 = 0;
  }
  else {
    sVar1 = 0;
    sVar3 = 0;
    do {
      lVar2 = 3 - (ulong)((uint)str[sVar1] < 0x800);
      if (str[sVar1] < L'\x80') {
        lVar2 = 1;
      }
      sVar3 = sVar3 + lVar2;
      sVar1 = sVar1 + 1;
    } while (charlen != sVar1);
  }
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  this = (CVmObjString *)CVmObject::operator_new(0x10,obj_id);
  CVmObjString(this,sVar3);
  if (charlen != 0) {
    p = (char *)(*(long *)((long)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].ptr_ + 8) + 2)
    ;
    sVar3 = 0;
    do {
      sVar1 = utf8_ptr::s_putch(p,str[sVar3]);
      p = p + sVar1;
      sVar3 = sVar3 + 1;
    } while (charlen != sVar3);
  }
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjString::create(VMG_ int in_root_set,
                                 const wchar_t *str, size_t charlen)
{
    /* get the utf8 byte length of the string */
    size_t i, bytelen;
    const wchar_t *src;
    for (src = str, i = 0, bytelen = 0 ; i < charlen ; ++src, ++i)
        bytelen += utf8_ptr::s_wchar_size(*src);

    /* allocate space */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjString(vmg_ bytelen);
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ id);

    /* build the string */
    utf8_ptr dst(s->cons_get_buf());
    for (src = str, i = 0 ; i < charlen ; ++src, ++i)
        dst.setch(*src);

    /* return the new string object ID */
    return id;
}